

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

bool __thiscall LiteScript::Class::operator!=(Class *this,Class *c)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  Object *pOVar4;
  Type *this_00;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar3 = (ulong)((long)(this->inherit).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inherit).
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar3 == 0) {
    bVar7 = true;
  }
  else {
    uVar3 = uVar3 & 0xffffffff;
    uVar5 = 1;
    lVar6 = 0;
    bVar7 = false;
    do {
      pOVar4 = Variable::operator->
                         ((Variable *)
                          ((long)&((this->inherit).
                                   super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->obj + lVar6));
      this_00 = Object::GetType(pOVar4);
      bVar2 = Type::operator==(this_00,(Type *)_type_class);
      if ((bVar2) &&
         (pOVar4 = Variable::operator->
                             ((Variable *)
                              ((long)&((this->inherit).
                                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->obj + lVar6)),
         (Class *)pOVar4->data == this)) {
        return bVar7;
      }
      bVar7 = uVar3 <= uVar5;
      lVar6 = lVar6 + 0x10;
      lVar1 = uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while (lVar1 - uVar3 != 1);
  }
  return bVar7;
}

Assistant:

const char * LiteScript::Namespace::GetKey(unsigned int idx) const {
    if (idx < this->vars.size())
        return this->vars[idx].first.c_str();
    else
        return nullptr;
}